

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMotorLinearDriveline::Setup(ChLinkMotorLinearDriveline *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  element_type *peVar5;
  ChLinkMate *pCVar6;
  char cVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  
  cVar7 = (**(code **)(**(long **)&(this->super_ChLinkMotorLinear).field_0x278 + 0x48))();
  auVar12._8_56_ = extraout_var;
  auVar12._0_8_ = extraout_XMM1_Qa;
  auVar9 = auVar12._0_16_;
  if (cVar7 != '\0') {
    *(undefined8 *)(*(long *)&(this->super_ChLinkMotorLinear).field_0x278 + 0x68) =
         *(undefined8 *)
          &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_x;
  }
  iVar8 = (*(((this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar8 != '\0') {
    pCVar6 = &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate;
    uVar1 = (pCVar6->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.offset_x;
    uVar3 = (pCVar6->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.offset_w;
    auVar10._4_4_ = uVar3;
    auVar10._0_4_ = uVar1;
    peVar5 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar9 = vpcmpeqd_avx(auVar9,auVar9);
    auVar10._8_8_ = 0;
    auVar9 = vpsubd_avx(auVar10,auVar9);
    (peVar5->super_ChPhysicsItem).offset_x = (int)auVar9._0_8_;
    (peVar5->super_ChPhysicsItem).offset_w = (int)((ulong)auVar9._0_8_ >> 0x20);
  }
  iVar8 = (*(((this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar8 != '\0') {
    pCVar6 = &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate;
    uVar2 = (pCVar6->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.offset_x;
    uVar4 = (pCVar6->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.offset_w;
    auVar11._4_4_ = uVar4;
    auVar11._0_4_ = uVar2;
    peVar5 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar9._8_4_ = 2;
    auVar9._0_8_ = 0x200000002;
    auVar9._12_4_ = 2;
    auVar11._8_8_ = 0;
    auVar9 = vpaddd_avx512vl(auVar11,auVar9);
    (peVar5->super_ChPhysicsItem).offset_x = (int)auVar9._0_8_;
    (peVar5->super_ChPhysicsItem).offset_w = (int)((ulong)auVar9._0_8_ >> 0x20);
  }
  iVar8 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (((this->innerconstraint1lin).
    super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  super_ChPhysicsItem).offset_L =
       iVar8 + (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  (((this->innerconstraint2lin).
    super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  super_ChPhysicsItem).offset_L =
       iVar8 + 1 +
       (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  (((this->innerconstraint2rot).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_ChPhysicsItem).offset_L =
       iVar8 + 2 +
       (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::Setup() {
    if (innershaft1lin->IsActive()) {
        innershaft1lin->SetOffset_x(this->offset_x + 0);
        innershaft1lin->SetOffset_w(this->offset_w + 0);
    }
    if (innershaft2lin->IsActive()) {
        innershaft2lin->SetOffset_x(this->offset_x + 1);
        innershaft2lin->SetOffset_w(this->offset_w + 1);
    }
    if (innershaft2rot->IsActive()) {
        innershaft2rot->SetOffset_x(this->offset_x + 2);
        innershaft2rot->SetOffset_w(this->offset_w + 2);
    }
    int nc = mask.nconstr;
    innerconstraint1lin->SetOffset_L(this->offset_L + nc + 0);
    innerconstraint2lin->SetOffset_L(this->offset_L + nc + 1);
    innerconstraint2rot->SetOffset_L(this->offset_L + nc + 2);
}